

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_writer.c
# Opt level: O0

int dlep_writer_map_l2neigh_data
              (dlep_writer *writer,dlep_extension *ext,oonf_layer2_data *data,oonf_layer2_data *def)

{
  _func_int_dlep_writer_ptr_oonf_layer2_data_ptr_oonf_layer2_metadata_ptr_uint16_t_uint16_t_uint64_t
  *p_Var1;
  int iVar2;
  dlep_neighbor_mapping *pdVar3;
  oonf_layer2_metadata *poVar4;
  bool bVar5;
  ulong local_50;
  size_t i;
  oonf_layer2_data *ptr;
  dlep_neighbor_mapping *map;
  oonf_layer2_data *def_local;
  oonf_layer2_data *data_local;
  dlep_extension *ext_local;
  dlep_writer *writer_local;
  
  local_50 = 0;
  while( true ) {
    if (ext->neigh_mapping_count <= local_50) {
      return 0;
    }
    pdVar3 = ext->neigh_mapping + local_50;
    i = (size_t)(data + pdVar3->layer2);
    bVar5 = false;
    if (((oonf_layer2_data *)i)->_origin != (oonf_layer2_origin *)0x0) {
      bVar5 = ((oonf_layer2_data *)i)->_meta != (oonf_layer2_metadata *)0x0;
    }
    if ((!bVar5) && (def != (oonf_layer2_data *)0x0)) {
      i = (size_t)(def + pdVar3->layer2);
    }
    p_Var1 = pdVar3->to_tlv;
    poVar4 = oonf_layer2_neigh_metadata_get(pdVar3->layer2);
    iVar2 = (*p_Var1)(writer,(oonf_layer2_data *)i,poVar4,pdVar3->dlep,pdVar3->length,
                      pdVar3->scaling);
    if (iVar2 != 0) break;
    local_50 = local_50 + 1;
  }
  return -((int)local_50 + 1);
}

Assistant:

int
dlep_writer_map_l2neigh_data(
  struct dlep_writer *writer, struct dlep_extension *ext, struct oonf_layer2_data *data, struct oonf_layer2_data *def) {
  struct dlep_neighbor_mapping *map;
  struct oonf_layer2_data *ptr;
  size_t i;

  for (i = 0; i < ext->neigh_mapping_count; i++) {
    map = &ext->neigh_mapping[i];

    ptr = &data[map->layer2];
    if (!oonf_layer2_data_has_value(ptr) && def) {
      ptr = &def[map->layer2];
    }

    if (map->to_tlv(writer, ptr, oonf_layer2_neigh_metadata_get(map->layer2), map->dlep, map->length, map->scaling)) {
      return -(i + 1);
    }
  }
  return 0;
}